

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::analyze_argument_buffers(CompilerMSL *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  BaseType BVar4;
  uint value;
  Variant *pVVar5;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *pSVar6;
  pointer pcVar7;
  undefined8 uVar8;
  SPIRVariable *pSVar9;
  SPIRVariable *pSVar10;
  size_t sVar11;
  CompilerGLSL *pCVar12;
  bool bVar13;
  undefined2 uVar14;
  Dim DVar15;
  bool bVar16;
  undefined1 uVar17;
  ImageFormat IVar18;
  AccessQualifier AVar19;
  TypeID TVar20;
  undefined4 uVar21;
  key_type kVar22;
  size_t *psVar23;
  bool bVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  TypeID TVar27;
  ID IVar28;
  uint32_t uVar29;
  long lVar30;
  TypedID<(spirv_cross::Types)0> *pTVar31;
  key_type kVar32;
  mapped_type *pmVar33;
  long *plVar34;
  SPIRType *pSVar35;
  SPIRType *pSVar36;
  SPIRType *pSVar37;
  MSLResourceBinding *rez_bind;
  SPIRType *pSVar38;
  const_iterator cVar39;
  mapped_type *pmVar40;
  const_iterator cVar41;
  size_type sVar42;
  runtime_error *prVar43;
  AlignedBuffer<Resource,_8UL> *pAVar44;
  ulong uVar45;
  uint *puVar46;
  string *psVar47;
  size_t sVar48;
  char *pcVar49;
  ID id;
  SmallVector<Resource,_8UL> *this_00;
  MSLConstexprSampler *pMVar50;
  CompilerMSL *pCVar51;
  MSLResourceBinding *in_R8;
  CompilerMSL *pCVar52;
  TypedID<(spirv_cross::Types)0> *pTVar53;
  Resource *pRVar54;
  CompilerMSL *pCVar55;
  size_t *psVar56;
  SmallVector<unsigned_int,_8UL> *pSVar57;
  pair<unsigned_int,_unsigned_int> pVar58;
  long lVar59;
  byte bVar60;
  uint32_t var_id;
  uint32_t next_arg_buff_index;
  uint32_t member_index;
  uint32_t uint_ptr_type_id;
  uint32_t ptr_type_id;
  SPIRType uint_type_pointer;
  __hashtable *__h;
  bool set_needs_buffer_sizes [8];
  bool set_needs_swizzle_buffer [8];
  SmallVector<unsigned_int,_8UL> inline_block_vars;
  SmallVector<Resource,_8UL> resources_in_set [8];
  char (*in_stack_ffffffffffffec48) [2];
  key_type local_1398;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_1390;
  uint32_t local_1388;
  uint local_1384;
  MSLConstexprSampler *local_1380;
  SPIRType *local_1378;
  uint32_t local_136c;
  key_type local_1368;
  map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  *local_1360;
  ParsedIR *local_1358;
  ID local_1350;
  undefined4 uStack_134c;
  undefined1 local_1340 [28];
  uint32_t local_1324;
  LoopLock local_1320 [2];
  uint local_1310 [4];
  undefined1 local_1300 [16];
  undefined1 auStack_12f0 [32];
  undefined8 local_12d0;
  uint32_t local_12c8 [8];
  bool *local_12a8;
  size_t sStack_12a0;
  size_t local_1298;
  bool local_1290 [8];
  uint32_t local_1288;
  undefined2 local_1284;
  StorageClass local_1280;
  TypedID<(spirv_cross::Types)1> *local_1278;
  size_t sStack_1270;
  size_t local_1268;
  TypedID<(spirv_cross::Types)1> local_1260 [8];
  uint *local_1240;
  size_t sStack_1238;
  size_t local_1230;
  uint local_1228 [8];
  TypeID local_1208;
  undefined8 local_11f0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_11e8;
  key_type local_11b0;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *local_11a8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_11a0;
  _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_1198;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1190;
  char local_1188 [16];
  string local_1178;
  SmallVector<unsigned_int,_8UL> local_1158;
  string local_1118;
  SmallVector<Resource,_8UL> local_10f8 [8];
  
  bVar60 = 0;
  this->argument_buffer_ids[4] = 0;
  this->argument_buffer_ids[5] = 0;
  this->argument_buffer_ids[6] = 0;
  this->argument_buffer_ids[7] = 0;
  this->argument_buffer_ids[0] = 0;
  this->argument_buffer_ids[1] = 0;
  this->argument_buffer_ids[2] = 0;
  this->argument_buffer_ids[3] = 0;
  lVar30 = 0x10c0;
  pAVar44 = &local_10f8[0].stack_storage;
  do {
    *(undefined8 *)((long)(pAVar44 + -1) + 0x1e8) = 0;
    *(undefined8 *)((long)(pAVar44 + -1) + 0x1f0) = 0;
    *(AlignedBuffer<Resource,_8UL> **)((long)(pAVar44 + -1) + 0x1e8) = pAVar44;
    *(undefined8 *)((long)(pAVar44 + -1) + 0x1f8) = 8;
    pAVar44 = (AlignedBuffer<Resource,_8UL> *)((long)(pAVar44 + 1) + 0x18);
    lVar30 = lVar30 + -0x218;
  } while (lVar30 != 0);
  local_1158.super_VectorView<unsigned_int>.ptr = (uint *)&local_1158.stack_storage;
  local_1158.super_VectorView<unsigned_int>.buffer_size = 0;
  local_1158.buffer_capacity = 8;
  local_1188[8] = '\0';
  local_1188[9] = '\0';
  local_1188[10] = '\0';
  local_1188[0xb] = '\0';
  local_1188[0xc] = '\0';
  local_1188[0xd] = '\0';
  local_1188[0xe] = '\0';
  local_1188[0xf] = '\0';
  local_1188[0] = '\0';
  local_1188[1] = '\0';
  local_1188[2] = '\0';
  local_1188[3] = '\0';
  local_1188[4] = '\0';
  local_1188[5] = '\0';
  local_1188[6] = '\0';
  local_1188[7] = '\0';
  local_1358 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_1358);
  sVar48 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar48 == 0) {
    bVar60 = 0;
  }
  else {
    pTVar53 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar31 = pTVar53 + sVar48;
    local_11a0 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&this->constexpr_samplers_by_id;
    local_11b0 = (key_type)&(this->super_CompilerGLSL).super_Compiler.interlocked_resources;
    local_1198 = &(this->inline_uniform_blocks)._M_h;
    local_11a8 = (SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL> *)&this->atomic_image_vars
    ;
    local_1190 = &(this->buffers_requiring_array_length)._M_h;
    local_1360 = (map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                  *)0x0;
    do {
      IVar28.id = pTVar53->id;
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar5[IVar28.id].type == TypeVariable) {
        kVar32 = (key_type)Variant::get<spirv_cross::SPIRVariable>(pVVar5 + IVar28.id);
        if ((*(StorageClass *)((long)kVar32 + 0x10) < (StorageClassStorageBuffer|StorageClassInput))
           && ((0x1005U >> (*(StorageClass *)((long)kVar32 + 0x10) & 0x1f) & 1) != 0)) {
          bVar24 = Compiler::is_hidden_variable((Compiler *)this,(SPIRVariable *)kVar32,false);
          if (!bVar24) {
            uVar26 = Compiler::get_decoration((Compiler *)this,IVar28,DecorationDescriptorSet);
            if (((uVar26 < 8) && ((this->msl_options).argument_buffers != false)) &&
               ((this->argument_buffer_discrete_mask >> (uVar26 & 0x1f) & 1) == 0)) {
              local_1398.desc_set = ((ID *)((long)kVar32 + 8))->id;
              local_1378 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)kVar32)
              ;
              if (7 < uVar26) {
                prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_1300._0_8_ = auStack_12f0;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1300,"Descriptor set index is out of range.","");
                ::std::runtime_error::runtime_error(prVar43,(string *)local_1300);
                *(undefined ***)prVar43 = &PTR__runtime_error_003fce08;
                __cxa_throw(prVar43,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if (*(int *)&(local_1378->super_IVariant).field_0xc - 0x11U < 2) {
                local_1380 = find_constexpr_sampler(this,local_1398.desc_set);
                if (local_1380 == (MSLConstexprSampler *)0x0) {
                  local_1380 = (MSLConstexprSampler *)0x0;
                }
                else {
                  pmVar33 = ::std::
                            map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                            ::operator[]((map<unsigned_int,_spirv_cross::MSLConstexprSampler,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLConstexprSampler>_>_>
                                          *)local_11a0,&local_1398.desc_set);
                  pMVar50 = local_1380;
                  for (lVar30 = 0x19; lVar30 != 0; lVar30 = lVar30 + -1) {
                    pmVar33->coord = pMVar50->coord;
                    pMVar50 = (MSLConstexprSampler *)((long)pMVar50 + (ulong)bVar60 * -8 + 4);
                    pmVar33 = (mapped_type *)((long)pmVar33 + (ulong)bVar60 * -8 + 4);
                  }
                }
              }
              else {
                local_1380 = (MSLConstexprSampler *)0x0;
              }
              local_1368 = kVar32;
              if ((*(StorageClass *)((long)kVar32 + 0x10) == StorageClassStorageBuffer) ||
                 (*(StorageClass *)((long)kVar32 + 0x10) == StorageClassUniform)) {
                sVar48 = local_10f8[uVar26].super_VectorView<Resource>.buffer_size;
                if (sVar48 == 0) goto LAB_002ac06e;
                pRVar54 = local_10f8[uVar26].super_VectorView<Resource>.ptr;
                local_1390 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0;
                lVar30 = 0;
                do {
                  uVar29 = Compiler::get_decoration
                                     ((Compiler *)this,
                                      (ID)*(uint32_t *)(*(long *)((long)&pRVar54->var + lVar30) + 8)
                                      ,DecorationBinding);
                  uVar25 = Compiler::get_decoration
                                     ((Compiler *)this,(ID)local_1398.desc_set,DecorationBinding);
                  pSVar6 = local_1390;
                  if (uVar29 == uVar25) {
                    bVar24 = false;
                    if ((*(int *)((long)&pRVar54->basetype + lVar30) == 0xf) &&
                       (*(int *)&(local_1378->super_IVariant).field_0xc == 0xf)) {
                      pSVar6 = *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> **)
                                ((long)&pRVar54->var + lVar30);
                      iVar3 = (int)pSVar6->buffer_capacity;
                      if ((iVar3 != 0xc) && (iVar3 != 2)) goto LAB_002ac056;
                      *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> **)
                       ((long)&pRVar54->descriptor_alias + lVar30) = pSVar6;
                      sVar42 = ::std::
                               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                        *)local_11b0,&local_1398.desc_set);
                      bVar24 = true;
                      if (sVar42 != 0) {
                        local_1350.id = *(uint32_t *)(*(long *)((long)&pRVar54->var + lVar30) + 8);
                        local_1300._0_4_ = local_11b0.desc_set;
                        local_1300._4_4_ = local_11b0.binding;
                        ::std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)local_11b0,(string *)&local_1350,local_1300);
                      }
                    }
                  }
                  else {
LAB_002ac056:
                    bVar24 = false;
                    pSVar6 = local_1390;
                  }
                  local_1390 = pSVar6;
                } while ((!bVar24) &&
                        (bVar24 = sVar48 * 0x40 + -0x40 != lVar30, lVar30 = lVar30 + 0x40, bVar24));
              }
              else {
LAB_002ac06e:
                local_1390 = (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0;
              }
              uVar29 = Compiler::get_decoration
                                 ((Compiler *)this,(ID)local_1398.desc_set,DecorationBinding);
              kVar32 = local_1368;
              if (*(int *)&(local_1378->super_IVariant).field_0xc == 0x11) {
                pSVar35 = local_1378;
                CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1398.desc_set);
                local_1340._16_4_ = 1;
                if ((local_1380 != (MSLConstexprSampler *)0x0) &&
                   (local_1380->ycbcr_conversion_enable == true)) {
                  local_1340._16_4_ = local_1380->planes;
                }
                if (local_1340._16_4_ != 0) {
                  uVar29 = 0;
                  do {
                    uVar25 = get_metal_resource_index(this,(SPIRVariable *)kVar32,Image,uVar29);
                    kVar22 = local_1368;
                    local_1368.desc_set = kVar32.desc_set;
                    local_1368.binding = kVar32.binding;
                    local_1300._0_4_ = local_1368.desc_set;
                    local_1300._4_4_ = local_1368.binding;
                    local_1300._8_4_ = SUB84(local_1390,0);
                    local_1300._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                    pSVar35 = (SPIRType *)0x0;
                    local_1368 = kVar22;
                    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                              (auStack_12f0,this,(ulong)local_1398.desc_set);
                    local_12d0 = CONCAT44(uVar25,Image);
                    local_12c8[0] = uVar29;
                    SmallVector<Resource,_8UL>::push_back
                              (local_10f8 + uVar26,(Resource *)local_1300);
                    if ((SPIRType *)auStack_12f0._0_8_ != (SPIRType *)(auStack_12f0 + 0x10)) {
                      operator_delete((void *)auStack_12f0._0_8_);
                    }
                    uVar29 = uVar29 + 1;
                  } while (local_1340._16_4_ != uVar29);
                }
                pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                if ((local_1380 == (MSLConstexprSampler *)0x0) &&
                   ((local_1378->image).dim != DimBuffer)) {
                  pSVar35 = (SPIRType *)0x0;
                  uVar29 = get_metal_resource_index(this,(SPIRVariable *)kVar32,Sampler,0);
                  kVar22 = local_1368;
                  local_1368.desc_set = kVar32.desc_set;
                  local_1368.binding = kVar32.binding;
                  local_1300._0_4_ = local_1368.desc_set;
                  local_1300._4_4_ = local_1368.binding;
                  local_1300._8_4_ = SUB84(local_1390,0);
                  local_1300._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                  local_1368 = kVar22;
                  to_sampler_expression_abi_cxx11_((string *)auStack_12f0,this,local_1398.desc_set);
                  local_12d0 = CONCAT44(uVar29,Sampler);
                  local_12c8[0] = 0;
                  SmallVector<Resource,_8UL>::push_back(local_10f8 + uVar26,(Resource *)local_1300);
                  psVar47 = (string *)auStack_12f0;
                  pSVar36 = (SPIRType *)auStack_12f0._0_8_;
LAB_002ac24a:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)auStack_12f0._0_8_ != &psVar47->field_2) {
                    operator_delete((void *)auStack_12f0._0_8_);
                    auStack_12f0._0_8_ = pSVar36;
                    pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                  }
                }
              }
              else {
                pSVar35 = (SPIRType *)(ulong)uVar26;
                local_1300._4_4_ = uVar29;
                local_1300._0_4_ = uVar26;
                cVar41 = ::std::
                         _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(local_1198,(key_type *)local_1300);
                if (cVar41.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                    (__node_type *)0x0) {
                  pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                  if (local_1380 == (MSLConstexprSampler *)0x0) {
                    bVar24 = is_supported_argument_buffer_type(this,local_1378);
                    pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                    if (bVar24) {
                      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,local_1398.desc_set)
                      ;
                      uVar29 = 0xffffffff;
                      if (local_1390 ==
                          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)0x0) {
                        uVar29 = get_metal_resource_index
                                           (this,(SPIRVariable *)kVar32,
                                            *(BaseType *)&(local_1378->super_IVariant).field_0xc,0);
                      }
                      kVar22 = local_1368;
                      local_1368.desc_set = kVar32.desc_set;
                      local_1368.binding = kVar32.binding;
                      local_1300._0_4_ = local_1368.desc_set;
                      local_1300._4_4_ = local_1368.binding;
                      local_1300._8_4_ = SUB84(local_1390,0);
                      local_1300._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                      pSVar35 = (SPIRType *)0x0;
                      local_1368 = kVar22;
                      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                (auStack_12f0,this,(ulong)local_1398.desc_set);
                      local_12d0 = CONCAT44(uVar29,*(BaseType *)
                                                    &(local_1378->super_IVariant).field_0xc);
                      local_12c8[0] = 0;
                      SmallVector<Resource,_8UL>::push_back
                                (local_10f8 + uVar26,(Resource *)local_1300);
                      if ((SPIRType *)auStack_12f0._0_8_ != (SPIRType *)(auStack_12f0 + 0x10)) {
                        operator_delete((void *)auStack_12f0._0_8_);
                      }
                      local_1300._0_4_ = ((ID *)((long)kVar32 + 8))->id;
                      sVar42 = ::std::
                               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                               ::count((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                        *)local_11a8,(key_type *)local_1300);
                      pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                      if (sVar42 != 0) {
                        uVar29 = get_metal_resource_index
                                           (this,(SPIRVariable *)kVar32,AtomicCounter,0);
                        kVar22 = local_1368;
                        local_1368.desc_set = kVar32.desc_set;
                        local_1368.binding = kVar32.binding;
                        local_1300._0_4_ = local_1368.desc_set;
                        local_1300._4_4_ = local_1368.binding;
                        local_1300._8_4_ = SUB84(local_1390,0);
                        local_1300._12_4_ = (undefined4)((ulong)local_1390 >> 0x20);
                        local_1368 = kVar22;
                        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                  ((string *)&local_1350,this,(ulong)local_1398.desc_set,1);
                        plVar34 = (long *)::std::__cxx11::string::append((char *)&local_1350);
                        pSVar35 = (SPIRType *)(plVar34 + 2);
                        if ((SPIRType *)*plVar34 == pSVar35) {
                          auStack_12f0._16_8_ = (pSVar35->super_IVariant)._vptr_IVariant;
                          auStack_12f0._24_8_ = plVar34[3];
                          auStack_12f0._0_8_ = (SPIRType *)(auStack_12f0 + 0x10);
                        }
                        else {
                          auStack_12f0._16_8_ = (pSVar35->super_IVariant)._vptr_IVariant;
                          auStack_12f0._0_8_ = (SPIRType *)*plVar34;
                        }
                        auStack_12f0._8_4_ = (undefined4)plVar34[1];
                        auStack_12f0._12_4_ = (undefined4)((ulong)plVar34[1] >> 0x20);
                        *plVar34 = (long)pSVar35;
                        plVar34[1] = 0;
                        *(undefined1 *)(plVar34 + 2) = 0;
                        local_12d0 = CONCAT44(uVar29,Struct);
                        local_12c8[0] = 0;
                        SmallVector<Resource,_8UL>::push_back
                                  (local_10f8 + uVar26,(Resource *)local_1300);
                        pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                        if ((SPIRType *)auStack_12f0._0_8_ != (SPIRType *)(auStack_12f0 + 0x10)) {
                          operator_delete((void *)auStack_12f0._0_8_);
                          pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                        }
                        auStack_12f0._0_8_ = CONCAT44(uStack_134c,local_1350.id);
                        psVar47 = (string *)&local_1350;
                        goto LAB_002ac24a;
                      }
                    }
                  }
                }
                else {
                  SmallVector<unsigned_int,_8UL>::reserve
                            (&local_1158,
                             (size_t)((long)&((IVariant *)
                                             local_1158.super_VectorView<unsigned_int>.buffer_size)
                                             ->_vptr_IVariant + 1));
                  *(uint32_t *)
                   ((char *)local_1158.super_VectorView<unsigned_int>.ptr +
                   local_1158.super_VectorView<unsigned_int>.buffer_size * 4) = local_1398.desc_set;
                  pSVar35 = (SPIRType *)
                            ((long)&((IVariant *)
                                    local_1158.super_VectorView<unsigned_int>.buffer_size)->
                                    _vptr_IVariant + 1);
                  local_1158.super_VectorView<unsigned_int>.buffer_size = (size_t)pSVar35;
                  pSVar36 = (SPIRType *)auStack_12f0._0_8_;
                }
              }
              auStack_12f0._0_8_ = pSVar36;
              if (this->needs_swizzle_buffer_def == true) {
                bVar24 = Compiler::is_sampled_image_type((Compiler *)this,local_1378);
                if (!bVar24) goto LAB_002ac49f;
                pcVar49 = local_1188 + 8;
                uVar45 = (ulong)local_1360 & 0xffffffff;
              }
              else {
LAB_002ac49f:
                local_1300._0_4_ = local_1398.desc_set;
                sVar42 = ::std::
                         _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         ::count(local_1190,(key_type *)local_1300);
                uVar45 = CONCAT71((int7)((ulong)pSVar35 >> 8),1);
                pcVar49 = local_1188;
                if (sVar42 == 0) goto LAB_002abe88;
              }
              pcVar49[uVar26] = '\x01';
              local_1360 = (map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                            *)(uVar45 & 0xffffffff);
            }
          }
        }
      }
LAB_002abe88:
      pTVar53 = pTVar53 + 1;
    } while (pTVar53 != pTVar31);
    bVar60 = (byte)local_1360;
  }
  ParsedIR::LoopLock::~LoopLock(local_1320);
  if (((bVar60 | this->needs_swizzle_buffer_def) & 1) != 0) {
    local_1350.id = 0;
    this_00 = local_10f8;
    lVar30 = 0;
    do {
      cVar2 = local_1188[lVar30 + 8];
      if ((cVar2 != '\0') || (local_1188[lVar30] == '\x01')) {
        if (local_1350.id == 0) {
          local_1350.id = ParsedIR::increase_bound_by(local_1358,1);
          uVar26 = get_uint_type_id(this);
          pSVar35 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                               super_VectorView<spirv_cross::Variant>.ptr + uVar26);
          SPIRType::SPIRType((SPIRType *)local_1300,pSVar35);
          local_1284._0_1_ = true;
          local_1288 = local_1288 + 1;
          TVar27.id = get_uint_type_id(this);
          local_11f0._4_4_ = TVar27.id;
          local_1280 = StorageClassUniform;
          Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                    ((Compiler *)this,local_1350.id,(SPIRType *)local_1300);
          Compiler::set_decoration((Compiler *)this,local_1350,DecorationArrayStride,4);
          local_1300._0_8_ = &PTR__SPIRType_003fd210;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_11e8);
          sStack_1238 = 0;
          if (local_1240 != local_1228) {
            free(local_1240);
          }
          sStack_1270 = 0;
          if (local_1278 != local_1260) {
            free(local_1278);
          }
          sStack_12a0 = 0;
          if (local_12a8 != local_1290) {
            free(local_12a8);
          }
          auStack_12f0._24_8_ = 0;
          if ((uint32_t *)auStack_12f0._16_8_ != local_12c8) {
            free((void *)auStack_12f0._16_8_);
          }
        }
        if (cVar2 != '\0') {
          IVar28.id = ParsedIR::increase_bound_by(local_1358,1);
          local_1300._0_8_ = local_1300._0_8_ & 0xffffffff00000000;
          kVar32 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)this,IVar28.id,(uint *)&local_1350,
                              (StorageClass *)local_1300);
          local_1300._0_8_ = auStack_12f0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1300,"spvSwizzleConstants","");
          Compiler::set_name((Compiler *)this,IVar28,(string *)local_1300);
          if ((undefined1 *)local_1300._0_8_ != auStack_12f0) {
            operator_delete((void *)local_1300._0_8_);
          }
          Compiler::set_decoration((Compiler *)this,IVar28,DecorationDescriptorSet,(uint32_t)lVar30)
          ;
          Compiler::set_decoration((Compiler *)this,IVar28,DecorationBinding,0xfffffffe);
          local_1300._8_4_ = 0;
          local_1300._12_4_ = 0;
          local_1300._0_8_ = kVar32;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (auStack_12f0,this,(ulong)IVar28.id);
          local_12d0 = CONCAT44(local_12d0._4_4_,UInt);
          uVar26 = get_metal_resource_index(this,(SPIRVariable *)kVar32,UInt,0);
          local_12d0 = CONCAT44(uVar26,(BaseType)local_12d0);
          local_12c8[0] = 0;
          SmallVector<Resource,_8UL>::push_back(this_00,(Resource *)local_1300);
          if ((SPIRType *)auStack_12f0._0_8_ != (SPIRType *)(auStack_12f0 + 0x10)) {
            operator_delete((void *)auStack_12f0._0_8_);
          }
        }
        if (local_1188[lVar30] == '\x01') {
          IVar28.id = ParsedIR::increase_bound_by(local_1358,1);
          local_1300._0_8_ = local_1300._0_8_ & 0xffffffff00000000;
          kVar32 = (key_type)
                   Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                             ((Compiler *)this,IVar28.id,(uint *)&local_1350,
                              (StorageClass *)local_1300);
          local_1300._0_8_ = auStack_12f0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1300,"spvBufferSizeConstants","");
          Compiler::set_name((Compiler *)this,IVar28,(string *)local_1300);
          if ((undefined1 *)local_1300._0_8_ != auStack_12f0) {
            operator_delete((void *)local_1300._0_8_);
          }
          Compiler::set_decoration((Compiler *)this,IVar28,DecorationDescriptorSet,(uint32_t)lVar30)
          ;
          Compiler::set_decoration((Compiler *)this,IVar28,DecorationBinding,0xfffffffd);
          local_1300._8_4_ = 0;
          local_1300._12_4_ = 0;
          local_1300._0_8_ = kVar32;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (auStack_12f0,this,(ulong)IVar28.id);
          local_12d0 = CONCAT44(local_12d0._4_4_,UInt);
          uVar26 = get_metal_resource_index(this,(SPIRVariable *)kVar32,UInt,0);
          local_12d0 = CONCAT44(uVar26,(BaseType)local_12d0);
          local_12c8[0] = 0;
          SmallVector<Resource,_8UL>::push_back(this_00,(Resource *)local_1300);
          if ((SPIRType *)auStack_12f0._0_8_ != (SPIRType *)(auStack_12f0 + 0x10)) {
            operator_delete((void *)auStack_12f0._0_8_);
          }
        }
      }
      lVar30 = lVar30 + 1;
      this_00 = this_00 + 1;
    } while (lVar30 != 8);
  }
  puVar46 = local_1158.super_VectorView<unsigned_int>.ptr;
  if ((SPIRType *)local_1158.super_VectorView<unsigned_int>.buffer_size != (SPIRType *)0x0) {
    lVar30 = local_1158.super_VectorView<unsigned_int>.buffer_size << 2;
    lVar59 = 0;
    do {
      IVar28.id = *(uint32_t *)((char *)puVar46 + lVar59);
      kVar32 = (key_type)
               Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + IVar28.id);
      uVar26 = Compiler::get_decoration((Compiler *)this,IVar28,DecorationDescriptorSet);
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,IVar28.id);
      local_1300._8_4_ = 0;
      local_1300._12_4_ = 0;
      local_1300._0_8_ = kVar32;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (auStack_12f0,this,(ulong)IVar28.id);
      local_12d0 = CONCAT44(local_12d0._4_4_,Struct);
      uVar29 = get_metal_resource_index(this,(SPIRVariable *)kVar32,Struct,0);
      local_12d0 = CONCAT44(uVar29,(BaseType)local_12d0);
      local_12c8[0] = 0;
      SmallVector<Resource,_8UL>::push_back(local_10f8 + uVar26,(Resource *)local_1300);
      if ((SPIRType *)auStack_12f0._0_8_ != (SPIRType *)(auStack_12f0 + 0x10)) {
        operator_delete((void *)auStack_12f0._0_8_);
      }
      lVar59 = lVar59 + 4;
    } while (lVar30 != lVar59);
  }
  local_1384 = 0;
  local_1378 = (SPIRType *)&this->plane_name_suffix;
  local_1360 = &this->buffers_requiring_dynamic_offset;
  local_1190 = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)&(this->buffers_requiring_dynamic_offset)._M_t._M_impl.super__Rb_tree_header;
  local_1198 = &(this->inline_uniform_blocks)._M_h;
  local_11a0 = &(this->atomic_image_vars)._M_h;
  local_11a8 = &this->buffer_aliases_argument;
  uVar45 = 0;
  do {
    if (local_10f8[uVar45].super_VectorView<Resource>.buffer_size != 0) {
      if (((this->msl_options).argument_buffers != true) ||
         ((1 << ((byte)uVar45 & 0x1f) & this->argument_buffer_discrete_mask) != 0)) {
        __assert_fail("descriptor_set_is_argument_buffer(desc_set)",
                      "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x43c9,"void spirv_cross::CompilerMSL::analyze_argument_buffers()");
      }
      IVar28.id = ParsedIR::increase_bound_by(local_1358,3);
      kVar32.binding = 0;
      kVar32.desc_set = IVar28.id;
      id.id = IVar28.id + 1;
      local_1324 = IVar28.id + 2;
      this->argument_buffer_ids[local_1384] = IVar28.id;
      pSVar35 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,id.id);
      *(undefined4 *)&(pSVar35->super_IVariant).field_0xc = 0xf;
      puVar46 = (uint *)(ulong)local_1384;
      if ((this->argument_buffer_device_storage_mask >> (local_1384 & 0x1f) & 1) == 0) {
        pSVar35->storage = StorageClassUniform;
      }
      else {
        pSVar35->storage = StorageClassStorageBuffer;
        Compiler::set_decoration((Compiler *)this,IVar28,DecorationNonWritable,0);
        puVar46 = (uint *)0x0;
        Compiler::set_decoration((Compiler *)this,id,DecorationBlock,0);
      }
      join<char_const(&)[23],unsigned_int&>
                ((string *)local_1300,(spirv_cross *)"spvDescriptorSetBuffer",
                 (char (*) [23])&local_1384,puVar46);
      Compiler::set_name((Compiler *)this,id,(string *)local_1300);
      local_1368 = kVar32;
      if ((undefined1 *)local_1300._0_8_ != auStack_12f0) {
        operator_delete((void *)local_1300._0_8_);
      }
      pSVar36 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,local_1324);
      (pSVar36->super_IVariant).self.id = (pSVar35->super_IVariant).self.id;
      uVar26 = pSVar35->vecsize;
      uVar29 = pSVar35->columns;
      *(undefined8 *)&(pSVar36->super_IVariant).field_0xc =
           *(undefined8 *)&(pSVar35->super_IVariant).field_0xc;
      pSVar36->vecsize = uVar26;
      pSVar36->columns = uVar29;
      SmallVector<unsigned_int,_8UL>::operator=(&pSVar36->array,&pSVar35->array);
      SmallVector<bool,_8UL>::operator=(&pSVar36->array_size_literal,&pSVar35->array_size_literal);
      bVar24 = pSVar35->pointer;
      bVar13 = pSVar35->forward_pointer;
      uVar14 = *(undefined2 *)&pSVar35->field_0x7e;
      pSVar36->pointer_depth = pSVar35->pointer_depth;
      pSVar36->pointer = bVar24;
      pSVar36->forward_pointer = bVar13;
      *(undefined2 *)&pSVar36->field_0x7e = uVar14;
      pSVar36->storage = pSVar35->storage;
      local_1390 = &pSVar35->member_types;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                (&pSVar36->member_types,local_1390);
      SmallVector<unsigned_int,_8UL>::operator=
                (&pSVar36->member_type_index_redirection,&pSVar35->member_type_index_redirection);
      DVar15 = (pSVar35->image).dim;
      bVar24 = (pSVar35->image).depth;
      bVar13 = (pSVar35->image).arrayed;
      bVar16 = (pSVar35->image).ms;
      uVar17 = (pSVar35->image).field_0xb;
      uVar26 = (pSVar35->image).sampled;
      IVar18 = (pSVar35->image).format;
      AVar19 = (pSVar35->image).access;
      TVar27.id = (pSVar35->type_alias).id;
      TVar20.id = (pSVar35->parent_type).id;
      (pSVar36->image).type = (TypeID)(pSVar35->image).type.id;
      (pSVar36->image).dim = DVar15;
      (pSVar36->image).depth = bVar24;
      (pSVar36->image).arrayed = bVar13;
      (pSVar36->image).ms = bVar16;
      (pSVar36->image).field_0xb = uVar17;
      (pSVar36->image).sampled = uVar26;
      (pSVar36->image).format = IVar18;
      (pSVar36->image).access = AVar19;
      pSVar36->type_alias = (TypeID)TVar27.id;
      pSVar36->parent_type = (TypeID)TVar20.id;
      if (pSVar35 != pSVar36) {
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&pSVar36->member_name_cache,&(pSVar35->member_name_cache)._M_h);
      }
      pSVar36->pointer = true;
      pSVar36->pointer_depth = pSVar36->pointer_depth + 1;
      (pSVar36->parent_type).id = id.id;
      local_1300._0_4_ = 2;
      IVar28.id = local_1368.desc_set;
      psVar47 = (string *)local_1300;
      Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
                ((Compiler *)this,IVar28.id,&local_1324,(StorageClass *)local_1300);
      join<char_const(&)[17],unsigned_int&>
                ((string *)local_1300,(spirv_cross *)"spvDescriptorSet",(char (*) [17])&local_1384,
                 (uint *)psVar47);
      Compiler::set_name((Compiler *)this,IVar28,(string *)local_1300);
      if ((undefined1 *)local_1300._0_8_ != auStack_12f0) {
        operator_delete((void *)local_1300._0_8_);
      }
      sVar48 = local_10f8[uVar45].super_VectorView<Resource>.buffer_size;
      if (sVar48 != 0) {
        pRVar54 = local_10f8[uVar45].super_VectorView<Resource>.ptr;
        pCVar55 = (CompilerMSL *)((long)((sVar48 - ((long)(sVar48 + 1) >> 0x3f)) + 1) >> 1);
        pCVar51 = this;
        pSVar36 = pSVar35;
        if (0x1fffffffffffffe < (long)pCVar55) {
          pCVar55 = (CompilerMSL *)0x1ffffffffffffff;
        }
        do {
          pCVar52 = pCVar55;
          if ((long)pCVar52 < 1) {
            pSVar38 = (SPIRType *)0x0;
            pCVar52 = (CompilerMSL *)0x0;
            break;
          }
          pSVar37 = (SPIRType *)operator_new((long)pCVar52 << 6,(nothrow_t *)&::std::nothrow);
          pCVar55 = pCVar52;
          pSVar38 = pSVar37;
          if (pSVar37 == (SPIRType *)0x0) {
            pSVar38 = pSVar36;
            if (pCVar52 == (CompilerMSL *)0x1) {
              pCVar52 = pCVar51;
              pCVar55 = (CompilerMSL *)0x0;
            }
            else {
              pCVar12 = &pCVar52->super_CompilerGLSL;
              pCVar52 = pCVar51;
              pCVar55 = (CompilerMSL *)
                        ((ulong)((long)&(pCVar12->super_Compiler)._vptr_Compiler + 1) >> 1);
            }
          }
          pCVar51 = pCVar52;
          pSVar36 = pSVar38;
        } while (pSVar37 == (SPIRType *)0x0);
        if (pSVar38 == (SPIRType *)0x0) {
          pSVar38 = (SPIRType *)0x0;
          pCVar52 = (CompilerMSL *)0x0;
        }
        else if (pCVar52 != (CompilerMSL *)0x0) {
          pSVar9 = pRVar54->descriptor_alias;
          (pSVar38->super_IVariant)._vptr_IVariant = (_func_int **)pRVar54->var;
          *(SPIRVariable **)&(pSVar38->super_IVariant).self = pSVar9;
          *(SmallVector<unsigned_int,_8UL> **)&pSVar38->width = &pSVar38->array;
          pcVar7 = (pRVar54->name)._M_dataplus._M_p;
          paVar1 = &(pRVar54->name).field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar7 == paVar1) {
            sVar11 = *(size_t *)((long)&(pRVar54->name).field_2 + 8);
            (pSVar38->array).super_VectorView<unsigned_int>.ptr =
                 (uint *)paVar1->_M_allocated_capacity;
            (pSVar38->array).super_VectorView<unsigned_int>.buffer_size = sVar11;
          }
          else {
            *(pointer *)&pSVar38->width = pcVar7;
            (pSVar38->array).super_VectorView<unsigned_int>.ptr =
                 (uint *)paVar1->_M_allocated_capacity;
          }
          *(size_type *)&pSVar38->columns = (pRVar54->name)._M_string_length;
          (pRVar54->name)._M_dataplus._M_p = (pointer)paVar1;
          (pRVar54->name)._M_string_length = 0;
          (pRVar54->name).field_2._M_local_buf[0] = '\0';
          *(uint32_t *)(pSVar38->array).stack_storage.aligned_char = pRVar54->plane;
          (pSVar38->array).buffer_capacity = *(size_t *)&pRVar54->basetype;
          pSVar36 = pSVar38;
          if (pCVar52 != (CompilerMSL *)0x1) {
            lVar30 = (long)pCVar52 * 0x40 + -0x40;
            psVar23 = &(pSVar38->array_size_literal).super_VectorView<bool>.buffer_size;
            do {
              psVar56 = psVar23;
              psVar56[-4] = psVar56[-0xc];
              psVar56[-3] = psVar56[-0xb];
              psVar56[-2] = (size_t)psVar56;
              psVar23 = psVar56 + -8;
              if (psVar23 == (size_t *)psVar56[-10]) {
                *psVar56 = *psVar23;
                psVar56[1] = psVar56[-7];
              }
              else {
                psVar56[-2] = psVar56[-10];
                *psVar56 = psVar56[-8];
              }
              uVar8 = psVar56[-6];
              ((VectorView<bool> *)(psVar56 + -1))->ptr = (bool *)psVar56[-9];
              psVar56[-10] = (size_t)psVar23;
              psVar56[-9] = 0;
              *(undefined1 *)(psVar56 + -8) = 0;
              psVar56[2] = uVar8;
              *(undefined4 *)(psVar56 + 3) = *(undefined4 *)(psVar56 + -5);
              lVar30 = lVar30 + -0x40;
              psVar23 = psVar56 + 8;
            } while (lVar30 != 0);
            pSVar36 = (SPIRType *)(psVar56 + -4);
          }
          pSVar9 = *(SPIRVariable **)&(pSVar36->super_IVariant).self;
          pRVar54->var = (SPIRVariable *)(pSVar36->super_IVariant)._vptr_IVariant;
          pRVar54->descriptor_alias = pSVar9;
          ::std::__cxx11::string::operator=((string *)&pRVar54->name,(string *)&pSVar36->width);
          uVar21 = *(undefined4 *)((long)&(pSVar36->array).buffer_capacity + 4);
          pRVar54->basetype = *(undefined4 *)&(pSVar36->array).buffer_capacity;
          pRVar54->index = uVar21;
          pRVar54->plane = *(uint32_t *)(pSVar36->array).stack_storage.aligned_char;
        }
        if (pSVar38 == (SPIRType *)0x0) {
          ::std::
          __inplace_stable_sort<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (pRVar54,pRVar54 + sVar48);
        }
        else {
          ::std::
          __stable_sort_adaptive<spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,spirv_cross::CompilerMSL::analyze_argument_buffers()::Resource*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerMSL::analyze_argument_buffers()::__1>>
                    (pRVar54,pRVar54 + sVar48,pSVar38,pCVar52);
        }
        if (pCVar52 != (CompilerMSL *)0x0) {
          lVar30 = (long)pCVar52 << 6;
          pSVar57 = &pSVar38->array;
          do {
            if (pSVar57 !=
                (SmallVector<unsigned_int,_8UL> *)*(undefined1 **)((long)(pSVar57 + -1) + 0x28)) {
              operator_delete(*(undefined1 **)((long)(pSVar57 + -1) + 0x28));
            }
            pSVar57 = (SmallVector<unsigned_int,_8UL> *)
                      &(((SmallVector<bool,_8UL> *)(pSVar57 + 1))->super_VectorView<bool>).
                       buffer_size;
            lVar30 = lVar30 + -0x40;
          } while (lVar30 != 0);
        }
        operator_delete(pSVar38);
      }
      local_136c = 0;
      local_1388 = 0;
      sVar48 = local_10f8[uVar45].super_VectorView<Resource>.buffer_size;
      if (sVar48 != 0) {
        pRVar54 = local_10f8[uVar45].super_VectorView<Resource>.ptr;
        local_1340._16_8_ = pRVar54 + sVar48;
        do {
          pSVar9 = pRVar54->var;
          pSVar36 = Compiler::get_variable_data_type((Compiler *)this,pSVar9);
          if ((this->msl_options).pad_argument_buffer_resources == true) {
            if (pRVar54->descriptor_alias == (SPIRVariable *)0x0) {
LAB_002ad03b:
              do {
                if (pRVar54->index <= local_1388) break;
                rez_bind = get_argument_buffer_resource(this,local_1384,local_1388);
                BVar4 = rez_bind->basetype;
                if (0xd < BVar4 - Void) {
                  if (BVar4 == Image) {
LAB_002ad025:
                    add_argument_buffer_padding_image_type
                              (this,pSVar35,&local_136c,&local_1388,rez_bind);
                    in_R8 = rez_bind;
                    goto LAB_002ad03b;
                  }
                  if (BVar4 == SampledImage) {
                    if (local_1388 != rez_bind->msl_sampler) goto LAB_002ad025;
                  }
                  else if (BVar4 != Sampler) goto LAB_002ad03b;
                  add_argument_buffer_padding_sampler_type
                            (this,pSVar35,&local_136c,&local_1388,rez_bind);
                  in_R8 = rez_bind;
                  goto LAB_002ad03b;
                }
                add_argument_buffer_padding_buffer_type
                          (this,pSVar35,&local_136c,&local_1388,rez_bind);
                in_R8 = rez_bind;
              } while( true );
            }
            if ((pSVar36->array).super_VectorView<unsigned_int>.buffer_size == 0) {
              uVar26 = 1;
            }
            else {
              uVar26 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar36);
            }
            if (uVar26 == 0) {
              uVar26 = get_resource_array_size(this,(pSVar9->super_IVariant).self.id);
            }
            local_1388 = local_1388 + uVar26;
          }
          pcVar7 = (pRVar54->name)._M_dataplus._M_p;
          local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1178,pcVar7,pcVar7 + (pRVar54->name)._M_string_length);
          local_1118._M_dataplus._M_p = (pointer)&local_1118.field_2;
          psVar47 = &local_1118;
          pCVar51 = (CompilerMSL *)0x37af9f;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)psVar47,"m","");
          ensure_valid_name((string *)&local_1350,pCVar51,&local_1178,psVar47);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
            operator_delete(local_1118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
            operator_delete(local_1178._M_dataplus._M_p);
          }
          if (pRVar54->plane != 0) {
            join<std::__cxx11::string&,unsigned_int&>
                      ((string *)local_1300,(spirv_cross *)local_1378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pRVar54->plane,(uint *)psVar47);
            ::std::__cxx11::string::_M_append((char *)&local_1350,local_1300._0_8_);
            if ((undefined1 *)local_1300._0_8_ != auStack_12f0) {
              operator_delete((void *)local_1300._0_8_);
            }
          }
          Compiler::set_member_name
                    ((Compiler *)this,(TypeID)(pSVar35->super_IVariant).self.id,local_136c,
                     (string *)&local_1350);
          if ((pRVar54->basetype == Sampler) &&
             (*(int *)&(pSVar36->super_IVariant).field_0xc != 0x12)) {
            sVar48 = (pSVar36->array).super_VectorView<unsigned_int>.buffer_size;
            uVar26 = ParsedIR::increase_bound_by(local_1358,2 - (sVar48 == 0));
            pSVar38 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,uVar26);
            *(undefined4 *)&(pSVar38->super_IVariant).field_0xc = 0x12;
            pSVar38->storage = StorageClassUniformConstant;
            if (sVar48 == 0) {
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1390,
                         (pSVar35->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar48 = (pSVar35->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar35->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar48].id = uVar26;
            }
            else {
              pSVar37 = Compiler::set<spirv_cross::SPIRType>((Compiler *)this,uVar26 + 1);
              (pSVar37->super_IVariant).self.id = (pSVar38->super_IVariant).self.id;
              uVar29 = pSVar38->vecsize;
              uVar25 = pSVar38->columns;
              *(undefined8 *)&(pSVar37->super_IVariant).field_0xc =
                   *(undefined8 *)&(pSVar38->super_IVariant).field_0xc;
              pSVar37->vecsize = uVar29;
              pSVar37->columns = uVar25;
              local_11b0 = (key_type)&pSVar37->array;
              SmallVector<unsigned_int,_8UL>::operator=
                        ((SmallVector<unsigned_int,_8UL> *)local_11b0,&pSVar38->array);
              local_1380 = (MSLConstexprSampler *)&pSVar37->array_size_literal;
              SmallVector<bool,_8UL>::operator=
                        ((SmallVector<bool,_8UL> *)local_1380,&pSVar38->array_size_literal);
              bVar24 = pSVar38->pointer;
              bVar13 = pSVar38->forward_pointer;
              uVar14 = *(undefined2 *)&pSVar38->field_0x7e;
              pSVar37->pointer_depth = pSVar38->pointer_depth;
              pSVar37->pointer = bVar24;
              pSVar37->forward_pointer = bVar13;
              *(undefined2 *)&pSVar37->field_0x7e = uVar14;
              pSVar37->storage = pSVar38->storage;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                        (&pSVar37->member_types,&pSVar38->member_types);
              SmallVector<unsigned_int,_8UL>::operator=
                        (&pSVar37->member_type_index_redirection,
                         &pSVar38->member_type_index_redirection);
              DVar15 = (pSVar38->image).dim;
              bVar24 = (pSVar38->image).depth;
              bVar13 = (pSVar38->image).arrayed;
              bVar16 = (pSVar38->image).ms;
              uVar17 = (pSVar38->image).field_0xb;
              uVar29 = (pSVar38->image).sampled;
              IVar18 = (pSVar38->image).format;
              AVar19 = (pSVar38->image).access;
              TVar27.id = (pSVar38->type_alias).id;
              TVar20.id = (pSVar38->parent_type).id;
              (pSVar37->image).type = (TypeID)(pSVar38->image).type.id;
              (pSVar37->image).dim = DVar15;
              (pSVar37->image).depth = bVar24;
              (pSVar37->image).arrayed = bVar13;
              (pSVar37->image).ms = bVar16;
              (pSVar37->image).field_0xb = uVar17;
              (pSVar37->image).sampled = uVar29;
              (pSVar37->image).format = IVar18;
              (pSVar37->image).access = AVar19;
              pSVar37->type_alias = (TypeID)TVar27.id;
              pSVar37->parent_type = (TypeID)TVar20.id;
              if (pSVar38 != pSVar37) {
                ::std::
                _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                ::
                _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                          ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                            *)&pSVar37->member_name_cache,&(pSVar38->member_name_cache)._M_h);
              }
              SmallVector<unsigned_int,_8UL>::operator=
                        ((SmallVector<unsigned_int,_8UL> *)local_11b0,&pSVar36->array);
              SmallVector<bool,_8UL>::operator=
                        ((SmallVector<bool,_8UL> *)local_1380,&pSVar36->array_size_literal);
              (pSVar37->parent_type).id = uVar26;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1390,
                         (pSVar35->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar48 = (pSVar35->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar35->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar48].id = uVar26 + 1;
            }
            (pSVar35->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = sVar48 + 1;
          }
          else {
            local_1398.binding =
                 Compiler::get_decoration
                           ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,DecorationBinding)
            ;
            local_1398.desc_set = local_1384;
            if (pRVar54->basetype - Image < 3) {
              uVar26 = Compiler::get_variable_data_type_id((Compiler *)this,pSVar9);
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                        (local_1390,
                         (pSVar35->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size
                         + 1);
              sVar48 = (pSVar35->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
              (pSVar35->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .ptr[sVar48].id = uVar26;
              (pSVar35->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size = sVar48 + 1;
              if (pRVar54->plane == 0) {
                uVar26 = (pSVar9->super_IVariant).self.id;
                (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                          ((spirv_cross *)local_1320,this,local_1368,1);
                join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                          ((string *)local_1300,(spirv_cross *)local_1320,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x36612b,(char (*) [2])&local_1350,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_R8);
                Compiler::set_qualified_name((Compiler *)this,uVar26,(string *)local_1300);
                goto LAB_002ad543;
              }
            }
            else {
              cVar39 = ::std::
                       _Rb_tree<spirv_cross::SetBindingPair,_std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                       ::find(&local_1360->_M_t,&local_1398);
              if ((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)cVar39._M_node == local_1190) {
                cVar41 = ::std::
                         _Hashtable<spirv_cross::SetBindingPair,_spirv_cross::SetBindingPair,_std::allocator<spirv_cross::SetBindingPair>,_std::__detail::_Identity,_std::equal_to<spirv_cross::SetBindingPair>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(local_1198,&local_1398);
                if (cVar41.super__Node_iterator_base<spirv_cross::SetBindingPair,_true>._M_cur ==
                    (__node_type *)0x0) {
                  local_1300._0_4_ = (pSVar9->super_IVariant).self.id;
                  sVar42 = ::std::
                           _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           ::count(local_11a0,(key_type *)local_1300);
                  if (sVar42 == 0) {
                    if ((pRVar54->descriptor_alias == (SPIRVariable *)0x0) ||
                       (pRVar54->descriptor_alias == pRVar54->var)) {
                      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                                (local_1390,
                                 (pSVar35->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                 buffer_size + 1);
                      sVar48 = (pSVar35->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size;
                      (pSVar35->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar48].id
                           = *(uint32_t *)&(pSVar9->super_IVariant).field_0xc;
                      (pSVar35->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                           sVar48 + 1;
                    }
                    pSVar10 = pRVar54->descriptor_alias;
                    if ((pSVar10 == (SPIRVariable *)0x0) || (pSVar10 == pRVar54->var)) {
                      uVar26 = (pSVar9->super_IVariant).self.id;
                      if ((pSVar36->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                  (local_1320,this,local_1368,1);
                        join<char_const(&)[3],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                                  ((string *)local_1300,(spirv_cross *)"(*",(char (*) [3])local_1320
                                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x36612b,(char (*) [2])&local_1350,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x36641e,in_stack_ffffffffffffec48);
                        Compiler::set_qualified_name((Compiler *)this,uVar26,(string *)local_1300);
                      }
                      else {
                        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                                  ((spirv_cross *)local_1320,this,local_1368,1);
                        join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                                  ((string *)local_1300,(spirv_cross *)local_1320,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)0x36612b,(char (*) [2])&local_1350,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_R8);
                        Compiler::set_qualified_name((Compiler *)this,uVar26,(string *)local_1300);
                      }
                      goto LAB_002ad543;
                    }
                    uVar26 = (pSVar9->super_IVariant).self.id;
                    uVar29 = (pSVar10->super_IVariant).self.id;
                    SmallVector<std::pair<unsigned_int,_unsigned_int>,_8UL>::reserve
                              (local_11a8,
                               (this->buffer_aliases_argument).
                               super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size
                               + 1);
                    pVar58.second = uVar29;
                    pVar58.first = uVar26;
                    (this->buffer_aliases_argument).
                    super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.ptr
                    [(this->buffer_aliases_argument).
                     super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size] = pVar58;
                    psVar23 = &(this->buffer_aliases_argument).
                               super_VectorView<std::pair<unsigned_int,_unsigned_int>_>.buffer_size;
                    *psVar23 = *psVar23 + 1;
                  }
                  else {
                    TVar27.id = ParsedIR::increase_bound_by(local_1358,2);
                    local_1300._8_4_ = 0;
                    local_1300._0_8_ = &PTR__SPIRType_003fd210;
                    auStack_12f0._8_4_ = 1;
                    auStack_12f0._24_8_ = 0;
                    auStack_12f0._16_8_ = local_12c8;
                    local_12d0 = 8;
                    sStack_12a0 = 0;
                    local_12a8 = local_1290;
                    local_1298 = 8;
                    local_1288 = 0;
                    local_1284._0_1_ = false;
                    local_1284._1_1_ = false;
                    local_1280 = StorageClassGeneric;
                    sStack_1270 = 0;
                    local_1278 = local_1260;
                    local_1268 = 8;
                    sStack_1238 = 0;
                    local_1240 = local_1228;
                    local_1230 = 8;
                    local_1208.id = 0;
                    local_11f0._0_4_ = 0;
                    local_11f0._4_4_ = 0;
                    local_11e8._M_buckets = &local_11e8._M_single_bucket;
                    local_11e8._M_bucket_count = 1;
                    local_11e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
                    local_11e8._M_element_count = 0;
                    local_11e8._M_rehash_policy._M_max_load_factor = 1.0;
                    local_11e8._M_rehash_policy._M_next_resize = 0;
                    local_11e8._M_single_bucket = (__node_base_ptr)0x0;
                    local_1300._12_4_ = 0xb;
                    auStack_12f0._0_4_ = 0x20;
                    auStack_12f0._4_4_ = 1;
                    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                              ((Compiler *)this,TVar27.id,(SPIRType *)local_1300);
                    local_1284._0_1_ = true;
                    local_1288 = local_1288 + 1;
                    local_11f0._4_4_ = TVar27.id;
                    local_1280 = StorageClassStorageBuffer;
                    pSVar36 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                                        ((Compiler *)this,TVar27.id + 1,(SPIRType *)local_1300);
                    (pSVar36->super_IVariant).self.id = TVar27.id;
                    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                              (local_1390,
                               (pSVar35->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                               buffer_size + 1);
                    sVar48 = (pSVar35->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size;
                    (pSVar35->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar48].id =
                         TVar27.id + 1;
                    (pSVar35->member_types).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                         sVar48 + 1;
                    local_1300._0_8_ = &PTR__SPIRType_003fd210;
                    ::std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::~_Hashtable(&local_11e8);
                    sStack_1238 = 0;
                    if (local_1240 != local_1228) {
                      free(local_1240);
                    }
                    sStack_1270 = 0;
                    if (local_1278 != local_1260) {
                      free(local_1278);
                    }
                    sStack_12a0 = 0;
                    if (local_12a8 != local_1290) {
                      free(local_12a8);
                    }
                    auStack_12f0._24_8_ = 0;
                    if ((uint32_t *)auStack_12f0._16_8_ != local_12c8) {
                      free((void *)auStack_12f0._16_8_);
                    }
                  }
                }
                else {
                  if (pRVar54->descriptor_alias != (SPIRVariable *)0x0) {
                    prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_1300._0_8_ = auStack_12f0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1300,
                               "Descriptor aliasing is currently not supported with inline UBOs.",""
                              );
                    ::std::runtime_error::runtime_error(prVar43,(string *)local_1300);
                    *(undefined ***)prVar43 = &PTR__runtime_error_003fce08;
                    __cxa_throw(prVar43,&CompilerError::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  uVar26 = Compiler::get_variable_data_type_id((Compiler *)this,pSVar9);
                  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                            (local_1390,
                             (pSVar35->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                             buffer_size + 1);
                  sVar48 = (pSVar35->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size;
                  (pSVar35->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar48].id =
                       uVar26;
                  (pSVar35->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                       sVar48 + 1;
                  uVar26 = (pSVar9->super_IVariant).self.id;
                  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                            ((spirv_cross *)local_1320,this,local_1368,1);
                  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                            ((string *)local_1300,(spirv_cross *)local_1320,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x36612b,(char (*) [2])&local_1350,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_R8);
                  Compiler::set_qualified_name((Compiler *)this,uVar26,(string *)local_1300);
LAB_002ad543:
                  if ((undefined1 *)local_1300._0_8_ != auStack_12f0) {
                    operator_delete((void *)local_1300._0_8_);
                  }
                  if (local_1320[0].lock != local_1310) {
                    operator_delete(local_1320[0].lock);
                  }
                }
              }
              else {
                if (pRVar54->descriptor_alias != (SPIRVariable *)0x0) {
                  prVar43 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1300._0_8_ = auStack_12f0;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1300,
                             "Descriptor aliasing is currently not supported with dynamic offsets.",
                             "");
                  ::std::runtime_error::runtime_error(prVar43,(string *)local_1300);
                  *(undefined ***)prVar43 = &PTR__runtime_error_003fce08;
                  __cxa_throw(prVar43,&CompilerError::typeinfo,::std::runtime_error::~runtime_error)
                  ;
                }
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::reserve
                          (local_1390,
                           (pSVar35->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size + 1);
                sVar48 = (pSVar35->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
                (pSVar35->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[sVar48].id =
                     *(uint32_t *)&(pSVar9->super_IVariant).field_0xc;
                (pSVar35->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size =
                     sVar48 + 1;
                uVar26 = (pSVar9->super_IVariant).self.id;
                pmVar40 = ::std::
                          map<spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>,_std::less<spirv_cross::SetBindingPair>,_std::allocator<std::pair<const_spirv_cross::SetBindingPair,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                          ::operator[](local_1360,&local_1398);
                pmVar40->second = uVar26;
              }
            }
          }
          uVar26 = local_136c;
          Compiler::set_extended_member_decoration
                    ((Compiler *)this,(pSVar35->super_IVariant).self.id,local_136c,
                     SPIRVCrossDecorationResourceIndexPrimary,pRVar54->index);
          value = (pSVar9->super_IVariant).self.id;
          in_R8 = (MSLResourceBinding *)(ulong)value;
          Compiler::set_extended_member_decoration
                    ((Compiler *)this,(pSVar35->super_IVariant).self.id,uVar26,
                     SPIRVCrossDecorationInterfaceOrigID,value);
          local_136c = uVar26 + 1;
          if ((string *)CONCAT44(uStack_134c,local_1350.id) != (string *)local_1340) {
            operator_delete((undefined1 *)CONCAT44(uStack_134c,local_1350.id));
          }
          pRVar54 = pRVar54 + 1;
        } while (pRVar54 != (Resource *)local_1340._16_8_);
      }
    }
    local_1384 = local_1384 + 1;
    uVar45 = (ulong)local_1384;
    if (7 < local_1384) {
      local_1158.super_VectorView<unsigned_int>.buffer_size = 0;
      if ((AlignedBuffer<unsigned_int,_8UL> *)local_1158.super_VectorView<unsigned_int>.ptr !=
          &local_1158.stack_storage) {
        free(local_1158.super_VectorView<unsigned_int>.ptr);
      }
      lVar30 = 0xea8;
      do {
        SmallVector<Resource,_8UL>::~SmallVector
                  ((SmallVector<Resource,_8UL> *)
                   (local_10f8[0].stack_storage.aligned_char + lVar30 + -0x18));
        lVar30 = lVar30 + -0x218;
      } while (lVar30 != -0x218);
      return;
    }
  } while( true );
}

Assistant:

void CompilerMSL::analyze_argument_buffers()
{
	// Gather all used resources and sort them out into argument buffers.
	// Each argument buffer corresponds to a descriptor set in SPIR-V.
	// The [[id(N)]] values used correspond to the resource mapping we have for MSL.
	// Otherwise, the binding number is used, but this is generally not safe some types like
	// combined image samplers and arrays of resources. Metal needs different indices here,
	// while SPIR-V can have one descriptor set binding. To use argument buffers in practice,
	// you will need to use the remapping from the API.
	for (auto &id : argument_buffer_ids)
		id = 0;

	// Output resources, sorted by resource index & type.
	struct Resource
	{
		SPIRVariable *var;
		SPIRVariable *descriptor_alias;
		string name;
		SPIRType::BaseType basetype;
		uint32_t index;
		uint32_t plane;
	};
	SmallVector<Resource> resources_in_set[kMaxArgumentBuffers];
	SmallVector<uint32_t> inline_block_vars;

	bool set_needs_swizzle_buffer[kMaxArgumentBuffers] = {};
	bool set_needs_buffer_sizes[kMaxArgumentBuffers] = {};
	bool needs_buffer_sizes = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t self, SPIRVariable &var) {
		if ((var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		     var.storage == StorageClassStorageBuffer) &&
		    !is_hidden_variable(var))
		{
			uint32_t desc_set = get_decoration(self, DecorationDescriptorSet);
			// Ignore if it's part of a push descriptor set.
			if (!descriptor_set_is_argument_buffer(desc_set))
				return;

			uint32_t var_id = var.self;
			auto &type = get_variable_data_type(var);

			if (desc_set >= kMaxArgumentBuffers)
				SPIRV_CROSS_THROW("Descriptor set index is out of range.");

			const MSLConstexprSampler *constexpr_sampler = nullptr;
			if (type.basetype == SPIRType::SampledImage || type.basetype == SPIRType::Sampler)
			{
				constexpr_sampler = find_constexpr_sampler(var_id);
				if (constexpr_sampler)
				{
					// Mark this ID as a constexpr sampler for later in case it came from set/bindings.
					constexpr_samplers_by_id[var_id] = *constexpr_sampler;
				}
			}

			// Handle descriptor aliasing as well as we can.
			// We can handle aliasing of buffers by casting pointers, but not for typed resources.
			// Inline UBOs cannot be handled since it's not a pointer, but inline data.
			SPIRVariable *descriptor_alias = nullptr;
			if (var.storage == StorageClassUniform || var.storage == StorageClassStorageBuffer)
			{
				for (auto &resource : resources_in_set[desc_set])
				{
					if (get_decoration(resource.var->self, DecorationBinding) ==
					    get_decoration(var_id, DecorationBinding) &&
					    resource.basetype == SPIRType::Struct && type.basetype == SPIRType::Struct &&
					    (resource.var->storage == StorageClassUniform ||
					     resource.var->storage == StorageClassStorageBuffer))
					{
						descriptor_alias = resource.var;
						// Self-reference marks that we should declare the resource,
						// and it's being used as an alias (so we can emit void* instead).
						resource.descriptor_alias = resource.var;
						// Need to promote interlocked usage so that the primary declaration is correct.
						if (interlocked_resources.count(var_id))
							interlocked_resources.insert(resource.var->self);
						break;
					}
				}
			}

			uint32_t binding = get_decoration(var_id, DecorationBinding);
			if (type.basetype == SPIRType::SampledImage)
			{
				add_resource_name(var_id);

				uint32_t plane_count = 1;
				if (constexpr_sampler && constexpr_sampler->ycbcr_conversion_enable)
					plane_count = constexpr_sampler->planes;

				for (uint32_t i = 0; i < plane_count; i++)
				{
					uint32_t image_resource_index = get_metal_resource_index(var, SPIRType::Image, i);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_name(var_id), SPIRType::Image, image_resource_index, i });
				}

				if (type.image.dim != DimBuffer && !constexpr_sampler)
				{
					uint32_t sampler_resource_index = get_metal_resource_index(var, SPIRType::Sampler);
					resources_in_set[desc_set].push_back(
					    { &var, descriptor_alias, to_sampler_expression(var_id), SPIRType::Sampler, sampler_resource_index, 0 });
				}
			}
			else if (inline_uniform_blocks.count(SetBindingPair{ desc_set, binding }))
			{
				inline_block_vars.push_back(var_id);
			}
			else if (!constexpr_sampler && is_supported_argument_buffer_type(type))
			{
				// constexpr samplers are not declared as resources.
				// Inline uniform blocks are always emitted at the end.
				add_resource_name(var_id);

				uint32_t resource_index = ~0u;
				if (!descriptor_alias)
					resource_index = get_metal_resource_index(var, type.basetype);

				resources_in_set[desc_set].push_back(
					{ &var, descriptor_alias, to_name(var_id), type.basetype, resource_index, 0 });

				// Emulate texture2D atomic operations
				if (atomic_image_vars.count(var.self))
				{
					uint32_t buffer_resource_index = get_metal_resource_index(var, SPIRType::AtomicCounter, 0);
					resources_in_set[desc_set].push_back(
						{ &var, descriptor_alias, to_name(var_id) + "_atomic", SPIRType::Struct, buffer_resource_index, 0 });
				}
			}

			// Check if this descriptor set needs a swizzle buffer.
			if (needs_swizzle_buffer_def && is_sampled_image_type(type))
				set_needs_swizzle_buffer[desc_set] = true;
			else if (buffer_requires_array_length(var_id))
			{
				set_needs_buffer_sizes[desc_set] = true;
				needs_buffer_sizes = true;
			}
		}
	});

	if (needs_swizzle_buffer_def || needs_buffer_sizes)
	{
		uint32_t uint_ptr_type_id = 0;

		// We might have to add a swizzle buffer resource to the set.
		for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
		{
			if (!set_needs_swizzle_buffer[desc_set] && !set_needs_buffer_sizes[desc_set])
				continue;

			if (uint_ptr_type_id == 0)
			{
				uint_ptr_type_id = ir.increase_bound_by(1);

				// Create a buffer to hold extra data, including the swizzle constants.
				SPIRType uint_type_pointer = get_uint_type();
				uint_type_pointer.pointer = true;
				uint_type_pointer.pointer_depth++;
				uint_type_pointer.parent_type = get_uint_type_id();
				uint_type_pointer.storage = StorageClassUniform;
				set<SPIRType>(uint_ptr_type_id, uint_type_pointer);
				set_decoration(uint_ptr_type_id, DecorationArrayStride, 4);
			}

			if (set_needs_swizzle_buffer[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvSwizzleConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kSwizzleBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}

			if (set_needs_buffer_sizes[desc_set])
			{
				uint32_t var_id = ir.increase_bound_by(1);
				auto &var = set<SPIRVariable>(var_id, uint_ptr_type_id, StorageClassUniformConstant);
				set_name(var_id, "spvBufferSizeConstants");
				set_decoration(var_id, DecorationDescriptorSet, desc_set);
				set_decoration(var_id, DecorationBinding, kBufferSizeBufferBinding);
				resources_in_set[desc_set].push_back(
				    { &var, nullptr, to_name(var_id), SPIRType::UInt, get_metal_resource_index(var, SPIRType::UInt), 0 });
			}
		}
	}

	// Now add inline uniform blocks.
	for (uint32_t var_id : inline_block_vars)
	{
		auto &var = get<SPIRVariable>(var_id);
		uint32_t desc_set = get_decoration(var_id, DecorationDescriptorSet);
		add_resource_name(var_id);
		resources_in_set[desc_set].push_back(
		    { &var, nullptr, to_name(var_id), SPIRType::Struct, get_metal_resource_index(var, SPIRType::Struct), 0 });
	}

	for (uint32_t desc_set = 0; desc_set < kMaxArgumentBuffers; desc_set++)
	{
		auto &resources = resources_in_set[desc_set];
		if (resources.empty())
			continue;

		assert(descriptor_set_is_argument_buffer(desc_set));

		uint32_t next_id = ir.increase_bound_by(3);
		uint32_t type_id = next_id + 1;
		uint32_t ptr_type_id = next_id + 2;
		argument_buffer_ids[desc_set] = next_id;

		auto &buffer_type = set<SPIRType>(type_id);

		buffer_type.basetype = SPIRType::Struct;

		if ((argument_buffer_device_storage_mask & (1u << desc_set)) != 0)
		{
			buffer_type.storage = StorageClassStorageBuffer;
			// Make sure the argument buffer gets marked as const device.
			set_decoration(next_id, DecorationNonWritable);
			// Need to mark the type as a Block to enable this.
			set_decoration(type_id, DecorationBlock);
		}
		else
			buffer_type.storage = StorageClassUniform;

		set_name(type_id, join("spvDescriptorSetBuffer", desc_set));

		auto &ptr_type = set<SPIRType>(ptr_type_id);
		ptr_type = buffer_type;
		ptr_type.pointer = true;
		ptr_type.pointer_depth++;
		ptr_type.parent_type = type_id;

		uint32_t buffer_variable_id = next_id;
		set<SPIRVariable>(buffer_variable_id, ptr_type_id, StorageClassUniform);
		set_name(buffer_variable_id, join("spvDescriptorSet", desc_set));

		// Ids must be emitted in ID order.
		stable_sort(begin(resources), end(resources), [&](const Resource &lhs, const Resource &rhs) -> bool {
			return tie(lhs.index, lhs.basetype) < tie(rhs.index, rhs.basetype);
		});

		uint32_t member_index = 0;
		uint32_t next_arg_buff_index = 0;
		for (auto &resource : resources)
		{
			auto &var = *resource.var;
			auto &type = get_variable_data_type(var);

			// If needed, synthesize and add padding members.
			// member_index and next_arg_buff_index are incremented when padding members are added.
			if (msl_options.pad_argument_buffer_resources)
			{
				if (!resource.descriptor_alias)
				{
					while (resource.index > next_arg_buff_index)
					{
						auto &rez_bind = get_argument_buffer_resource(desc_set, next_arg_buff_index);
						switch (rez_bind.basetype)
						{
						case SPIRType::Void:
						case SPIRType::Boolean:
						case SPIRType::SByte:
						case SPIRType::UByte:
						case SPIRType::Short:
						case SPIRType::UShort:
						case SPIRType::Int:
						case SPIRType::UInt:
						case SPIRType::Int64:
						case SPIRType::UInt64:
						case SPIRType::AtomicCounter:
						case SPIRType::Half:
						case SPIRType::Float:
						case SPIRType::Double:
							add_argument_buffer_padding_buffer_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Image:
							add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::Sampler:
							add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						case SPIRType::SampledImage:
							if (next_arg_buff_index == rez_bind.msl_sampler)
								add_argument_buffer_padding_sampler_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							else
								add_argument_buffer_padding_image_type(buffer_type, member_index, next_arg_buff_index, rez_bind);
							break;
						default:
							break;
						}
					}
				}

				// Adjust the number of slots consumed by current member itself.
				// If actual member is an array, allow runtime array resolution as well.
				uint32_t elem_cnt = type.array.empty() ? 1 : to_array_size_literal(type);
				if (elem_cnt == 0)
					elem_cnt = get_resource_array_size(var.self);

				next_arg_buff_index += elem_cnt;
			}

			string mbr_name = ensure_valid_name(resource.name, "m");
			if (resource.plane > 0)
				mbr_name += join(plane_name_suffix, resource.plane);
			set_member_name(buffer_type.self, member_index, mbr_name);

			if (resource.basetype == SPIRType::Sampler && type.basetype != SPIRType::Sampler)
			{
				// Have to synthesize a sampler type here.

				bool type_is_array = !type.array.empty();
				uint32_t sampler_type_id = ir.increase_bound_by(type_is_array ? 2 : 1);
				auto &new_sampler_type = set<SPIRType>(sampler_type_id);
				new_sampler_type.basetype = SPIRType::Sampler;
				new_sampler_type.storage = StorageClassUniformConstant;

				if (type_is_array)
				{
					uint32_t sampler_type_array_id = sampler_type_id + 1;
					auto &sampler_type_array = set<SPIRType>(sampler_type_array_id);
					sampler_type_array = new_sampler_type;
					sampler_type_array.array = type.array;
					sampler_type_array.array_size_literal = type.array_size_literal;
					sampler_type_array.parent_type = sampler_type_id;
					buffer_type.member_types.push_back(sampler_type_array_id);
				}
				else
					buffer_type.member_types.push_back(sampler_type_id);
			}
			else
			{
				uint32_t binding = get_decoration(var.self, DecorationBinding);
				SetBindingPair pair = { desc_set, binding };

				if (resource.basetype == SPIRType::Image || resource.basetype == SPIRType::Sampler ||
				    resource.basetype == SPIRType::SampledImage)
				{
					// Drop pointer information when we emit the resources into a struct.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					if (resource.plane == 0)
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (buffers_requiring_dynamic_offset.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with dynamic offsets.");

					// Don't set the qualified name here; we'll define a variable holding the corrected buffer address later.
					buffer_type.member_types.push_back(var.basetype);
					buffers_requiring_dynamic_offset[pair].second = var.self;
				}
				else if (inline_uniform_blocks.count(pair))
				{
					if (resource.descriptor_alias)
						SPIRV_CROSS_THROW("Descriptor aliasing is currently not supported with inline UBOs.");

					// Put the buffer block itself into the argument buffer.
					buffer_type.member_types.push_back(get_variable_data_type_id(var));
					set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
				else if (atomic_image_vars.count(var.self))
				{
					// Emulate texture2D atomic operations.
					// Don't set the qualified name: it's already set for this variable,
					// and the code that references the buffer manually appends "_atomic"
					// to the name.
					uint32_t offset = ir.increase_bound_by(2);
					uint32_t atomic_type_id = offset;
					uint32_t type_ptr_id = offset + 1;

					SPIRType atomic_type;
					atomic_type.basetype = SPIRType::AtomicCounter;
					atomic_type.width = 32;
					atomic_type.vecsize = 1;
					set<SPIRType>(atomic_type_id, atomic_type);

					atomic_type.pointer = true;
					atomic_type.pointer_depth++;
					atomic_type.parent_type = atomic_type_id;
					atomic_type.storage = StorageClassStorageBuffer;
					auto &atomic_ptr_type = set<SPIRType>(type_ptr_id, atomic_type);
					atomic_ptr_type.self = atomic_type_id;

					buffer_type.member_types.push_back(type_ptr_id);
				}
				else
				{
					if (!resource.descriptor_alias || resource.descriptor_alias == resource.var)
						buffer_type.member_types.push_back(var.basetype);

					if (resource.descriptor_alias && resource.descriptor_alias != resource.var)
						buffer_aliases_argument.push_back({ var.self, resource.descriptor_alias->self });
					else if (type.array.empty())
						set_qualified_name(var.self, join("(*", to_name(buffer_variable_id), ".", mbr_name, ")"));
					else
						set_qualified_name(var.self, join(to_name(buffer_variable_id), ".", mbr_name));
				}
			}

			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationResourceIndexPrimary,
			                               resource.index);
			set_extended_member_decoration(buffer_type.self, member_index, SPIRVCrossDecorationInterfaceOrigID,
			                               var.self);
			member_index++;
		}
	}
}